

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGenerator::ResolveLanguageCompiler
          (cmGlobalGenerator *this,string *lang,cmMakefile *mf,bool optional)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  undefined8 name_00;
  bool bVar1;
  ulong uVar2;
  cmake *pcVar3;
  cmState *pcVar4;
  reference value;
  string *psVar5;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  cmValue local_1b0;
  cmValue cvars;
  string pathString;
  string local_170;
  undefined1 local_150 [8];
  string cnameString;
  string changeVars;
  undefined1 local_108 [8];
  cmList cnameArgList;
  cmValue cname;
  string local_d0;
  undefined1 local_b0 [8];
  string path;
  string *name;
  string local_80;
  cmValue local_50;
  undefined1 local_48 [8];
  string langComp;
  bool optional_local;
  cmMakefile *mf_local;
  string *lang_local;
  cmGlobalGenerator *this_local;
  
  langComp.field_2._M_local_buf[0xf] = optional;
  cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[10]>
            ((string *)local_48,(char (*) [7])0x11240fa,lang,(char (*) [10])0x1119ed0);
  local_50 = cmMakefile::GetDefinition(mf,(string *)local_48);
  bVar1 = cmValue::operator_cast_to_bool(&local_50);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    path.field_2._8_8_ = cmMakefile::GetRequiredDefinition(mf,(string *)local_48);
    std::__cxx11::string::string((string *)local_b0);
    bVar1 = cmsys::SystemTools::FileIsFullPath((string *)path.field_2._8_8_);
    name_00 = path.field_2._8_8_;
    if (bVar1) {
      std::__cxx11::string::operator=((string *)local_b0,(string *)path.field_2._8_8_);
    }
    else {
      cname.Value = (string *)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&cname);
      cmsys::SystemTools::FindProgram
                (&local_d0,(string *)name_00,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&cname,false);
      std::__cxx11::string::operator=((string *)local_b0,(string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&cname);
    }
    if (((langComp.field_2._M_local_buf[0xf] & 1U) != 0) ||
       ((uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0 &&
        (bVar1 = cmsys::SystemTools::FileExists((string *)local_b0), bVar1)))) {
      pcVar3 = GetCMakeInstance(this);
      pcVar4 = cmake::GetState(pcVar3);
      cnameArgList.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)cmState::GetInitializedCacheValue(pcVar4,(string *)local_48);
      cmList::cmList((cmList *)local_108);
      bVar1 = cmValue::operator_cast_to_bool
                        ((cmValue *)
                         &cnameArgList.Values.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar1) {
        cmValue::operator->[abi_cxx11_
                  ((cmValue *)
                   &cnameArgList.Values.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        uVar2 = std::__cxx11::string::empty();
        if ((uVar2 & 1) == 0) {
          psVar5 = cmValue::operator*[abi_cxx11_
                             ((cmValue *)
                              &cnameArgList.Values.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
          cmList::assign((cmList *)local_108,psVar5,Yes,No);
          value = cmList::front_abi_cxx11_((cmList *)local_108);
          cmValue::cmValue((cmValue *)((long)&changeVars.field_2 + 8),value);
          cnameArgList.Values.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)changeVars.field_2._8_8_;
        }
      }
      std::__cxx11::string::string((string *)(cnameString.field_2._M_local_buf + 8));
      bVar1 = cmValue::operator_cast_to_bool
                        ((cmValue *)
                         &cnameArgList.Values.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if ((bVar1) && ((langComp.field_2._M_local_buf[0xf] & 1U) == 0)) {
        std::__cxx11::string::string((string *)local_150);
        psVar5 = cmValue::operator*[abi_cxx11_
                           ((cmValue *)
                            &cnameArgList.Values.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        bVar1 = cmsys::SystemTools::FileIsFullPath(psVar5);
        if (bVar1) {
          psVar5 = cmValue::operator*[abi_cxx11_
                             ((cmValue *)
                              &cnameArgList.Values.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::__cxx11::string::operator=((string *)local_150,(string *)psVar5);
        }
        else {
          psVar5 = cmValue::operator*[abi_cxx11_
                             ((cmValue *)
                              &cnameArgList.Values.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pathString.field_2._8_8_ = 0;
          this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&pathString.field_2 + 8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(this_00);
          cmsys::SystemTools::FindProgram(&local_170,psVar5,this_00,false);
          std::__cxx11::string::operator=((string *)local_150,(string *)&local_170);
          std::__cxx11::string::~string((string *)&local_170);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&pathString.field_2 + 8));
        }
        std::__cxx11::string::string((string *)&cvars,(string *)local_b0);
        cmsys::SystemTools::ConvertToUnixSlashes((string *)local_150);
        cmsys::SystemTools::ConvertToUnixSlashes((string *)&cvars);
        bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_150,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&cvars);
        if (bVar1) {
          pcVar3 = GetCMakeInstance(this);
          pcVar4 = cmake::GetState(pcVar3);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1d0,"__CMAKE_DELETE_CACHE_CHANGE_VARS_",&local_1d1);
          local_1b0 = cmState::GetGlobalProperty(pcVar4,&local_1d0);
          std::__cxx11::string::~string((string *)&local_1d0);
          std::allocator<char>::~allocator(&local_1d1);
          bVar1 = cmValue::operator_cast_to_bool(&local_1b0);
          if (bVar1) {
            psVar5 = cmValue::operator*[abi_cxx11_(&local_1b0);
            std::__cxx11::string::operator+=
                      ((string *)(cnameString.field_2._M_local_buf + 8),(string *)psVar5);
            std::__cxx11::string::operator+=((string *)(cnameString.field_2._M_local_buf + 8),";");
          }
          std::__cxx11::string::operator+=
                    ((string *)(cnameString.field_2._M_local_buf + 8),(string *)local_48);
          std::__cxx11::string::operator+=((string *)(cnameString.field_2._M_local_buf + 8),";");
          psVar5 = cmValue::operator*[abi_cxx11_
                             ((cmValue *)
                              &cnameArgList.Values.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::__cxx11::string::operator+=
                    ((string *)(cnameString.field_2._M_local_buf + 8),(string *)psVar5);
          pcVar3 = GetCMakeInstance(this);
          pcVar4 = cmake::GetState(pcVar3);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1f8,"__CMAKE_DELETE_CACHE_CHANGE_VARS_",&local_1f9);
          cmState::SetGlobalProperty(pcVar4,&local_1f8,(string *)((long)&cnameString.field_2 + 8));
          std::__cxx11::string::~string((string *)&local_1f8);
          std::allocator<char>::~allocator(&local_1f9);
        }
        std::__cxx11::string::~string((string *)&cvars);
        std::__cxx11::string::~string((string *)local_150);
      }
      std::__cxx11::string::~string((string *)(cnameString.field_2._M_local_buf + 8));
      cmList::~cmList((cmList *)local_108);
    }
    std::__cxx11::string::~string((string *)local_b0);
  }
  else if ((langComp.field_2._M_local_buf[0xf] & 1U) == 0) {
    cmStrCat<std::__cxx11::string&,char_const(&)[31]>
              (&local_80,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
               (char (*) [31])" not set, after EnableLanguage");
    cmSystemTools::Error(&local_80);
    std::__cxx11::string::~string((string *)&local_80);
  }
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void cmGlobalGenerator::ResolveLanguageCompiler(const std::string& lang,
                                                cmMakefile* mf,
                                                bool optional) const
{
  std::string langComp = cmStrCat("CMAKE_", lang, "_COMPILER");

  if (!mf->GetDefinition(langComp)) {
    if (!optional) {
      cmSystemTools::Error(
        cmStrCat(langComp, " not set, after EnableLanguage"));
    }
    return;
  }
  std::string const& name = mf->GetRequiredDefinition(langComp);
  std::string path;
  if (!cmSystemTools::FileIsFullPath(name)) {
    path = cmSystemTools::FindProgram(name);
  } else {
    path = name;
  }
  if (!optional && (path.empty() || !cmSystemTools::FileExists(path))) {
    return;
  }
  cmValue cname =
    this->GetCMakeInstance()->GetState()->GetInitializedCacheValue(langComp);

  // Split compiler from arguments
  cmList cnameArgList;
  if (cname && !cname->empty()) {
    cnameArgList.assign(*cname);
    cname = cmValue(cnameArgList.front());
  }

  std::string changeVars;
  if (cname && !optional) {
    std::string cnameString;
    if (!cmSystemTools::FileIsFullPath(*cname)) {
      cnameString = cmSystemTools::FindProgram(*cname);
    } else {
      cnameString = *cname;
    }
    std::string pathString = path;
    // get rid of potentially multiple slashes:
    cmSystemTools::ConvertToUnixSlashes(cnameString);
    cmSystemTools::ConvertToUnixSlashes(pathString);
    if (cnameString != pathString) {
      cmValue cvars = this->GetCMakeInstance()->GetState()->GetGlobalProperty(
        "__CMAKE_DELETE_CACHE_CHANGE_VARS_");
      if (cvars) {
        changeVars += *cvars;
        changeVars += ";";
      }
      changeVars += langComp;
      changeVars += ";";
      changeVars += *cname;
      this->GetCMakeInstance()->GetState()->SetGlobalProperty(
        "__CMAKE_DELETE_CACHE_CHANGE_VARS_", changeVars);
    }
  }
}